

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

WriteToEndpoint *
soul::HEARTGenerator::getTopLevelWriteToEndpoint
          (WriteToEndpoint *ws,
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *values)

{
  Expression *pEVar1;
  WriteToEndpoint *pWVar2;
  
  do {
    pWVar2 = ws;
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::insert
              (values,values->items,&pWVar2->value);
    pEVar1 = (pWVar2->target).object;
    if (pEVar1 == (Expression *)0x0) {
      return pWVar2;
    }
    ws = (WriteToEndpoint *)
         __dynamic_cast(pEVar1,&AST::Expression::typeinfo,&AST::WriteToEndpoint::typeinfo,0);
  } while (ws != (WriteToEndpoint *)0x0);
  return pWVar2;
}

Assistant:

static AST::WriteToEndpoint& getTopLevelWriteToEndpoint (AST::WriteToEndpoint& ws, ArrayWithPreallocation<pool_ref<AST::Expression>, 4>& values)
    {
        values.insert (values.begin(), ws.value);

        if (auto chainedWrite = cast<AST::WriteToEndpoint> (ws.target))
            return getTopLevelWriteToEndpoint (*chainedWrite, values);

        return ws;
    }